

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  ulong uVar3;
  xpath_node *pxVar4;
  size_t sVar5;
  xpath_node *it;
  xpath_node *pxVar6;
  size_t sVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  xpath_context c;
  xpath_context local_58;
  
  sVar5 = ((long)ns->_end - (long)ns->_begin >> 4) - first;
  if (sVar5 != 0) {
    this_00 = this->_right;
    pxVar4 = ns->_begin + first;
    if ((this->_test & 0xfeU) == 2) {
      local_58.n._node._root = (xml_node_struct *)0x0;
      local_58.n._attribute._attr = (xml_attribute_struct *)0x0;
      local_58.position = 1;
      local_58.size = sVar5;
      dVar8 = eval_number(this_00,&local_58,stack);
      if ((1.0 <= dVar8) &&
         (auVar9._8_4_ = (int)(sVar5 >> 0x20), auVar9._0_8_ = sVar5, auVar9._12_4_ = 0x45300000,
         dVar8 <= (auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) {
        uVar3 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
        auVar10._8_4_ = (int)(uVar3 >> 0x20);
        auVar10._0_8_ = uVar3;
        auVar10._12_4_ = 0x45300000;
        dVar12 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        if ((dVar8 == dVar12) && (!NAN(dVar8) && !NAN(dVar12))) {
          pxVar1 = pxVar4[uVar3 - 1]._attribute._attr;
          (pxVar4->_node)._root = pxVar4[uVar3 - 1]._node._root;
          (pxVar4->_attribute)._attr = pxVar1;
          pxVar4 = pxVar4 + 1;
        }
      }
      ns->_end = pxVar4;
    }
    else if (this_00->_rettype == '\x02') {
      if (pxVar4 != ns->_end) {
        sVar7 = 1;
        pxVar6 = pxVar4;
        do {
          local_58.n._node._root = (pxVar6->_node)._root;
          local_58.n._attribute._attr = (pxVar6->_attribute)._attr;
          local_58.position = sVar7;
          local_58.size = sVar5;
          dVar8 = eval_number(this_00,&local_58,stack);
          auVar11._8_4_ = (int)(sVar7 >> 0x20);
          auVar11._0_8_ = sVar7;
          auVar11._12_4_ = 0x45300000;
          dVar12 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0);
          if ((dVar8 != dVar12) || (NAN(dVar8) || NAN(dVar12))) {
            bVar2 = true;
          }
          else {
            pxVar1 = (pxVar6->_attribute)._attr;
            (pxVar4->_node)._root = (pxVar6->_node)._root;
            (pxVar4->_attribute)._attr = pxVar1;
            pxVar4 = pxVar4 + 1;
            bVar2 = !once;
          }
          if (!bVar2) break;
          pxVar6 = pxVar6 + 1;
          sVar7 = sVar7 + 1;
        } while (pxVar6 != ns->_end);
      }
      ns->_end = pxVar4;
    }
    else {
      pxVar6 = pxVar4;
      if (pxVar4 != ns->_end) {
        sVar7 = 1;
        do {
          local_58.n._node._root = (pxVar4->_node)._root;
          local_58.n._attribute._attr = (pxVar4->_attribute)._attr;
          local_58.position = sVar7;
          local_58.size = sVar5;
          bVar2 = eval_boolean(this_00,&local_58,stack);
          if (bVar2) {
            pxVar1 = (pxVar4->_attribute)._attr;
            (pxVar6->_node)._root = (pxVar4->_node)._root;
            (pxVar6->_attribute)._attr = pxVar1;
            pxVar6 = pxVar6 + 1;
          }
          if (bVar2 && once) break;
          pxVar4 = pxVar4 + 1;
          sVar7 = sVar7 + 1;
        } while (pxVar4 != ns->_end);
      }
      ns->_end = pxVar6;
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}